

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  byte bVar1;
  int length;
  u32 uVar2;
  char *z_00;
  void *pvVar3;
  uint uVar4;
  uint local_b4;
  char *local_a8;
  int flags;
  u32 szEscape;
  u32 v;
  char c;
  char *pcStack_78;
  u32 nOut;
  char *zOut;
  char *z_2;
  u32 iOut;
  u32 iIn;
  char *z_1;
  double r;
  char x;
  char *pcStack_48;
  int bNeg;
  char *z;
  sqlite3_int64 iRes;
  sqlite3 *db;
  int rc;
  u32 sz;
  u32 n;
  int textOnly_local;
  sqlite3_context *pCtx_local;
  JsonParse *pJStack_10;
  u32 i_local;
  JsonParse *pParse_local;
  
  sz = textOnly;
  _n = pCtx;
  pCtx_local._4_4_ = i;
  pJStack_10 = pParse;
  iRes = (sqlite3_int64)sqlite3_context_db_handle(pCtx);
  rc = jsonbPayloadSize(pJStack_10,pCtx_local._4_4_,(u32 *)((long)&db + 4));
  if (rc == 0) {
    sqlite3_result_error(_n,"malformed JSON",-1);
    return;
  }
  switch(pJStack_10->aBlob[pCtx_local._4_4_] & 0xf) {
  case 0:
    if (db._4_4_ == 0) {
      sqlite3_result_null(_n);
      return;
    }
    break;
  case 1:
    if (db._4_4_ == 0) {
      sqlite3_result_int(_n,1);
      return;
    }
    break;
  case 2:
    if (db._4_4_ == 0) {
      sqlite3_result_int(_n,0);
      return;
    }
    break;
  case 3:
  case 4:
    z = (char *)0x0;
    r._4_4_ = 0;
    if (db._4_4_ == 0) break;
    r._3_1_ = pJStack_10->aBlob[pCtx_local._4_4_ + rc];
    if (r._3_1_ == '-') {
      if (db._4_4_ < 2) break;
      rc = rc + 1;
      db._4_4_ = db._4_4_ - 1;
      r._4_4_ = 1;
    }
    pcStack_48 = sqlite3DbStrNDup((sqlite3 *)iRes,
                                  (char *)(pJStack_10->aBlob + (pCtx_local._4_4_ + rc)),
                                  (long)(int)db._4_4_);
    if (pcStack_48 == (char *)0x0) goto LAB_001ed08d;
    db._0_4_ = sqlite3DecOrHexToI64(pcStack_48,(i64 *)&z);
    sqlite3DbFree((sqlite3 *)iRes,pcStack_48);
    if ((int)db == 0) {
      if (r._4_4_ == 0) {
        local_a8 = z;
      }
      else {
        local_a8 = (char *)-(long)z;
      }
      sqlite3_result_int64(_n,(i64)local_a8);
      return;
    }
    if (((int)db == 3) && (r._4_4_ != 0)) {
      sqlite3_result_int64(_n,-0x8000000000000000);
      return;
    }
    if ((int)db == 1) break;
    if (r._4_4_ != 0) {
      rc = rc + -1;
      db._4_4_ = db._4_4_ + 1;
    }
    goto LAB_001ecced;
  case 5:
  case 6:
    if (db._4_4_ == 0) break;
LAB_001ecced:
    z_00 = sqlite3DbStrNDup((sqlite3 *)iRes,(char *)(pJStack_10->aBlob + (pCtx_local._4_4_ + rc)),
                            (long)(int)db._4_4_);
    if (z_00 == (char *)0x0) {
      _iOut = (char *)0x0;
LAB_001ed08d:
      sqlite3_result_error_nomem(_n);
      return;
    }
    _iOut = z_00;
    length = sqlite3Strlen30(z_00);
    db._0_4_ = sqlite3AtoF(z_00,(double *)&z_1,length,'\x01');
    sqlite3DbFree((sqlite3 *)iRes,_iOut);
    if (0 < (int)db) {
      sqlite3_result_double(_n,(double)z_1);
      return;
    }
    break;
  case 7:
  case 10:
    sqlite3_result_text(_n,(char *)(pJStack_10->aBlob + (pCtx_local._4_4_ + rc)),db._4_4_,
                        (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  case 8:
  case 9:
    v = db._4_4_;
    zOut = (char *)(pJStack_10->aBlob + (pCtx_local._4_4_ + rc));
    pcStack_78 = (char *)sqlite3DbMallocRaw((sqlite3 *)iRes,(ulong)(db._4_4_ + 1));
    if (pcStack_78 != (char *)0x0) {
      z_2._0_4_ = 0;
      for (z_2._4_4_ = 0; z_2._4_4_ < db._4_4_; z_2._4_4_ = z_2._4_4_ + 1) {
        szEscape._3_1_ = zOut[z_2._4_4_];
        if (szEscape._3_1_ == '\\') {
          uVar2 = jsonUnescapeOneChar(zOut + z_2._4_4_,db._4_4_ - z_2._4_4_,(u32 *)&flags);
          bVar1 = (byte)flags;
          if ((uint)flags < 0x80) {
            pcStack_78[(uint)z_2] = bVar1;
            z_2._0_4_ = (uint)z_2 + 1;
          }
          else if ((uint)flags < 0x800) {
            uVar4 = (uint)z_2 + 1;
            pcStack_78[(uint)z_2] = (byte)((uint)flags >> 6) | 0xc0;
            z_2._0_4_ = (uint)z_2 + 2;
            pcStack_78[uVar4] = bVar1 & 0x3f | 0x80;
          }
          else if ((uint)flags < 0x10000) {
            pcStack_78[(uint)z_2] = (byte)((uint)flags >> 0xc) | 0xe0;
            uVar4 = (uint)z_2 + 2;
            pcStack_78[(uint)z_2 + 1] = (byte)((uint)flags >> 6) & 0x3f | 0x80;
            z_2._0_4_ = (uint)z_2 + 3;
            pcStack_78[uVar4] = bVar1 & 0x3f | 0x80;
          }
          else if (flags != 0x99999) {
            pcStack_78[(uint)z_2] = (byte)((uint)flags >> 0x12) | 0xf0;
            pcStack_78[(uint)z_2 + 1] = (byte)((uint)flags >> 0xc) & 0x3f | 0x80;
            uVar4 = (uint)z_2 + 3;
            pcStack_78[(uint)z_2 + 2] = (byte)((uint)flags >> 6) & 0x3f | 0x80;
            z_2._0_4_ = (uint)z_2 + 4;
            pcStack_78[uVar4] = bVar1 & 0x3f | 0x80;
          }
          z_2._4_4_ = (uVar2 - 1) + z_2._4_4_;
        }
        else {
          pcStack_78[(uint)z_2] = szEscape._3_1_;
          z_2._0_4_ = (uint)z_2 + 1;
        }
      }
      pcStack_78[(uint)z_2] = '\0';
      sqlite3_result_text(_n,pcStack_78,(uint)z_2,sqlite3OomClear);
      return;
    }
    pcStack_78 = (char *)0x0;
    goto LAB_001ed08d;
  case 0xb:
  case 0xc:
    if (sz == 0) {
      pvVar3 = sqlite3_user_data(_n);
      local_b4 = (uint)pvVar3;
    }
    else {
      local_b4 = 0;
    }
    if ((local_b4 & 8) != 0) {
      sqlite3_result_blob(_n,pJStack_10->aBlob + pCtx_local._4_4_,db._4_4_ + rc,
                          (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    jsonReturnTextJsonFromBlob(_n,pJStack_10->aBlob + pCtx_local._4_4_,db._4_4_ + rc);
    return;
  }
  sqlite3_result_error(_n,"malformed JSON",-1);
  return;
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}